

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> * __thiscall
embree::XMLLoader::loadVec2fArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  byte bVar1;
  size_type sVar2;
  runtime_error *this_00;
  long *in_RDX;
  Token *in_RDI;
  float fVar3;
  size_t i;
  Ref<embree::XML> *in_stack_000000d8;
  XMLLoader *in_stack_000000e0;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *data;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  size_type in_stack_fffffffffffffe78;
  ulong uVar4;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *this_01;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  XML *this_02;
  allocator *paVar5;
  Token *this_03;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  ulong local_120;
  undefined1 local_111;
  ParseLocation *in_stack_ffffffffffffff08;
  string local_f0 [35];
  undefined1 local_cd;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  long *local_78;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  float *local_30;
  float *local_28;
  float *local_20;
  float *local_10;
  reference local_8;
  
  if (*in_RDX == 0) {
    memset(in_RDI,0,0x18);
    std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
              ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)0x377b62);
  }
  else {
    this_02 = (XML *)*in_RDX;
    paVar5 = &local_b9;
    this_03 = in_RDI;
    local_78 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"ofs",paVar5);
    XML::parm(this_02,(string *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    bVar1 = std::operator!=(in_stack_fffffffffffffe60,
                            (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    if ((bVar1 & 1) == 0) {
      local_cd = 0;
      std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
                ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)0x377cb8);
      local_40 = local_78;
      sVar2 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_78 + 0x98)
                        );
      if ((sVar2 & 1) != 0) {
        local_111 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48 = local_78;
        ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff08);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       (char *)in_stack_fffffffffffffe60);
        std::runtime_error::runtime_error(this_00,local_f0);
        local_111 = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_50 = local_78;
      this_01 = (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)*local_78;
      std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                 &this_01[6].
                  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::resize
                (this_01,in_stack_fffffffffffffe78);
      local_120 = 0;
      while (uVar4 = local_120,
            sVar2 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::size
                              ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *
                               )this_03), uVar4 < sVar2) {
        local_58 = local_78;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_78 + 0x98),
                   local_120 * 2);
        local_12c = Token::Float(this_03,SUB81((ulong)paVar5 >> 0x38,0));
        local_60 = local_78;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_78 + 0x98),
                   local_120 * 2 + 1);
        fVar3 = Token::Float(this_03,SUB81((ulong)paVar5 >> 0x38,0));
        local_20 = &local_128;
        local_28 = &local_12c;
        local_30 = &local_130;
        local_128 = local_12c;
        local_124 = local_130;
        local_130 = fVar3;
        local_8 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::
                  operator[]((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                             this_03,local_120);
        local_10 = &local_128;
        (local_8->field_0).field_0.x = local_128;
        (local_8->field_0).field_0.y = local_124;
        local_120 = local_120 + 1;
      }
    }
    else {
      loadBinary<std::vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>>>
                (in_stack_000000e0,in_stack_000000d8);
    }
  }
  return (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)in_RDI;
}

Assistant:

std::vector<Vec2f> XMLLoader::loadVec2fArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec2f>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec2f>>(xml);
    } 
    else 
    {
      std::vector<Vec2f> data;
      if (xml->body.size() % 2 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float2> body");
      data.resize(xml->body.size()/2);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec2f(xml->body[2*i+0].Float(),xml->body[2*i+1].Float());
      return data;
    }
  }